

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O3

string * __thiscall
ApprovalTests::ApprovalTestNamer::getFullFileName
          (string *__return_storage_ptr__,ApprovalTestNamer *this,string *approved,
          string *extensionWithDot)

{
  ostream *poVar1;
  ApprovalTestNamer *this_00;
  stringstream ext;
  string local_1e8;
  undefined1 local_1c8 [32];
  stringstream local_1a8 [16];
  undefined1 local_198 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  getDirectory_abi_cxx11_((string *)local_1c8,this);
  this_00 = (ApprovalTestNamer *)local_1c8._0_8_;
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(char *)local_1c8._0_8_,local_1c8._8_8_);
  getOutputFileBaseName_abi_cxx11_(&local_1e8,this_00);
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(approved->_M_dataplus)._M_p,approved->_M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(extensionWithDot->_M_dataplus)._M_p,extensionWithDot->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if ((ApprovalTestNamer *)local_1c8._0_8_ != (ApprovalTestNamer *)(local_1c8 + 0x10)) {
    operator_delete((void *)local_1c8._0_8_);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  ::std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string
    ApprovalTestNamer::getFullFileName(const std::string& approved,
                                       const std::string& extensionWithDot) const
    {
        std::stringstream ext;
        ext << getDirectory() << getOutputFileBaseName() << approved << extensionWithDot;
        return ext.str();
    }